

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,unsigned_long *args_1,int *args_2)

{
  vector *pvVar1;
  char *pcVar2;
  int x;
  unsigned_long x_00;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_b8;
  string local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_40;
  allocator_type local_31;
  
  pvVar1 = (vector *)this->printer_;
  local_40 = format;
  ToString<int,void>(&local_b8,(Formatter *)(ulong)(uint)*args,(int)args);
  ToString<unsigned_long,void>(&local_98,(Formatter *)*args_1,x_00);
  ToString<int,void>(&local_78,(Formatter *)(ulong)(uint)*args_2,x);
  __l._M_len = 3;
  __l._M_array = &local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,__l,&local_31);
  google::protobuf::io::Printer::FormatInternal(pvVar1,(map *)&local_58,(char *)&this->vars_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  lVar3 = 0;
  do {
    pcVar2 = *(char **)((long)&local_78._M_dataplus._M_p + lVar3);
    if (local_78.field_2._M_local_buf + lVar3 != pcVar2) {
      operator_delete(pcVar2);
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x60);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }